

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O2

void __thiscall
CorUnix::CSynchCache<CorUnix::_OwnedObjectsListNode>::~CSynchCache
          (CSynchCache<CorUnix::_OwnedObjectsListNode> *this)

{
  Flush(this,(CPalThread *)0x0,true);
  InternalDeleteCriticalSection(&this->m_cs);
  return;
}

Assistant:

~CSynchCache()
        {        
            Flush(NULL, true);
            InternalDeleteCriticalSection(&m_cs); 
        }